

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O1

void testing::internal::JsonUnitTestResultPrinter::OutputJsonTestResult
               (ostream *stream,TestResult *result)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  int iVar2;
  TestPartResult *pTVar3;
  ostream *poVar4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar5;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *in_RCX;
  internal *piVar6;
  int iVar7;
  int iVar8;
  uint uVar9;
  string kIndent;
  string location;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  string message;
  long *local_d0;
  long local_c8;
  long local_c0 [2];
  string local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  string local_70;
  string local_50;
  
  local_d0 = local_c0;
  std::__cxx11::string::_M_construct((ulong)&local_d0,'\n');
  uVar9 = 0;
  if (0 < (int)((ulong)((long)(result->test_part_results_).
                              super__Vector_base<testing::TestPartResult,_std::allocator<testing::TestPartResult>_>
                              ._M_impl.super__Vector_impl_data._M_finish -
                       (long)(result->test_part_results_).
                             super__Vector_base<testing::TestPartResult,_std::allocator<testing::TestPartResult>_>
                             ._M_impl.super__Vector_impl_data._M_start) >> 4) * -0x49249249) {
    iVar7 = 0;
    do {
      pTVar3 = TestResult::GetTestPartResult(result,iVar7);
      iVar8 = (int)in_RCX;
      if (pTVar3->type_ - kNonFatalFailure < 2) {
        std::__ostream_insert<char,std::char_traits<char>>(stream,",\n",2);
        if (uVar9 == 0) {
          poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                             (stream,(char *)local_d0,local_c8);
          std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\"",1);
          std::__ostream_insert<char,std::char_traits<char>>(poVar4,"failures",8);
          std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\": [\n",5);
        }
        piVar6 = (internal *)(pTVar3->file_name_)._M_string_length;
        if (piVar6 != (internal *)0x0) {
          piVar6 = (internal *)(pTVar3->file_name_)._M_dataplus._M_p;
        }
        FormatCompilerIndependentFileLocation_abi_cxx11_
                  (&local_b0,piVar6,(char *)(ulong)(uint)pTVar3->line_number_,iVar8);
        local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_90,local_b0._M_dataplus._M_p,
                   local_b0._M_dataplus._M_p + local_b0._M_string_length);
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                  (&local_90,"\n");
        pbVar5 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                 append(&local_90,(pTVar3->message_)._M_dataplus._M_p);
        local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
        paVar1 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  *)(pbVar5->_M_dataplus)._M_p;
        in_RCX = &pbVar5->field_2;
        if (paVar1 == in_RCX) {
          local_70.field_2._M_allocated_capacity = in_RCX->_M_allocated_capacity;
          local_70.field_2._8_8_ = *(undefined8 *)((long)&pbVar5->field_2 + 8);
        }
        else {
          local_70.field_2._M_allocated_capacity = in_RCX->_M_allocated_capacity;
          local_70._M_dataplus._M_p = (pointer)paVar1;
        }
        local_70._M_string_length = pbVar5->_M_string_length;
        (pbVar5->_M_dataplus)._M_p = (pointer)in_RCX;
        pbVar5->_M_string_length = 0;
        (pbVar5->field_2)._M_local_buf[0] = '\0';
        EscapeJson(&local_50,&local_70);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_70._M_dataplus._M_p != &local_70.field_2) {
          operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_90._M_dataplus._M_p != &local_90.field_2) {
          operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
        }
        poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                           (stream,(char *)local_d0,local_c8);
        std::__ostream_insert<char,std::char_traits<char>>(poVar4,"  {\n",4);
        poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                           (poVar4,(char *)local_d0,local_c8);
        std::__ostream_insert<char,std::char_traits<char>>(poVar4,"    \"failure\": \"",0x10);
        poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                           (poVar4,local_50._M_dataplus._M_p,local_50._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\",\n",3);
        poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                           (poVar4,(char *)local_d0,local_c8);
        std::__ostream_insert<char,std::char_traits<char>>(poVar4,"    \"type\": \"\"\n",0xf);
        poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                           (poVar4,(char *)local_d0,local_c8);
        std::__ostream_insert<char,std::char_traits<char>>(poVar4,"  }",3);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_50._M_dataplus._M_p != &local_50.field_2) {
          operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
          operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
        }
        uVar9 = uVar9 + 1;
      }
      iVar7 = iVar7 + 1;
      iVar8 = (int)((ulong)((long)(result->test_part_results_).
                                  super__Vector_base<testing::TestPartResult,_std::allocator<testing::TestPartResult>_>
                                  ._M_impl.super__Vector_impl_data._M_finish -
                           (long)(result->test_part_results_).
                                 super__Vector_base<testing::TestPartResult,_std::allocator<testing::TestPartResult>_>
                                 ._M_impl.super__Vector_impl_data._M_start) >> 4);
    } while (SBORROW4(iVar7,iVar8 * -0x49249249) != iVar7 + iVar8 * 0x49249249 < 0);
    uVar9 = (uint)(0 < (int)uVar9);
  }
  if ((char)uVar9 != '\0') {
    std::__ostream_insert<char,std::char_traits<char>>(stream,"\n",1);
    poVar4 = std::__ostream_insert<char,std::char_traits<char>>(stream,(char *)local_d0,local_c8);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,"]",1);
  }
  if (0 < (int)((ulong)((long)(result->test_part_results_).
                              super__Vector_base<testing::TestPartResult,_std::allocator<testing::TestPartResult>_>
                              ._M_impl.super__Vector_impl_data._M_finish -
                       (long)(result->test_part_results_).
                             super__Vector_base<testing::TestPartResult,_std::allocator<testing::TestPartResult>_>
                             ._M_impl.super__Vector_impl_data._M_start) >> 4) * -0x49249249) {
    iVar7 = 0;
    iVar8 = 0;
    do {
      pTVar3 = TestResult::GetTestPartResult(result,iVar7);
      iVar2 = (int)in_RCX;
      if (pTVar3->type_ == kSkip) {
        std::__ostream_insert<char,std::char_traits<char>>(stream,",\n",2);
        if (iVar8 == 0) {
          poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                             (stream,(char *)local_d0,local_c8);
          std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\"",1);
          std::__ostream_insert<char,std::char_traits<char>>(poVar4,"skipped",7);
          std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\": [\n",5);
        }
        piVar6 = (internal *)(pTVar3->file_name_)._M_string_length;
        if (piVar6 != (internal *)0x0) {
          piVar6 = (internal *)(pTVar3->file_name_)._M_dataplus._M_p;
        }
        FormatCompilerIndependentFileLocation_abi_cxx11_
                  (&local_b0,piVar6,(char *)(ulong)(uint)pTVar3->line_number_,iVar2);
        local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_90,local_b0._M_dataplus._M_p,
                   local_b0._M_dataplus._M_p + local_b0._M_string_length);
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                  (&local_90,"\n");
        pbVar5 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                 append(&local_90,(pTVar3->message_)._M_dataplus._M_p);
        local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
        paVar1 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  *)(pbVar5->_M_dataplus)._M_p;
        in_RCX = &pbVar5->field_2;
        if (paVar1 == in_RCX) {
          local_70.field_2._M_allocated_capacity = in_RCX->_M_allocated_capacity;
          local_70.field_2._8_8_ = *(undefined8 *)((long)&pbVar5->field_2 + 8);
        }
        else {
          local_70.field_2._M_allocated_capacity = in_RCX->_M_allocated_capacity;
          local_70._M_dataplus._M_p = (pointer)paVar1;
        }
        local_70._M_string_length = pbVar5->_M_string_length;
        (pbVar5->_M_dataplus)._M_p = (pointer)in_RCX;
        pbVar5->_M_string_length = 0;
        (pbVar5->field_2)._M_local_buf[0] = '\0';
        EscapeJson(&local_50,&local_70);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_70._M_dataplus._M_p != &local_70.field_2) {
          operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_90._M_dataplus._M_p != &local_90.field_2) {
          operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
        }
        poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                           (stream,(char *)local_d0,local_c8);
        std::__ostream_insert<char,std::char_traits<char>>(poVar4,"  {\n",4);
        poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                           (poVar4,(char *)local_d0,local_c8);
        std::__ostream_insert<char,std::char_traits<char>>(poVar4,"    \"message\": \"",0x10);
        poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                           (poVar4,local_50._M_dataplus._M_p,local_50._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\"\n",2);
        poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                           (poVar4,(char *)local_d0,local_c8);
        std::__ostream_insert<char,std::char_traits<char>>(poVar4,"  }",3);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_50._M_dataplus._M_p != &local_50.field_2) {
          operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
          operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
        }
        iVar8 = iVar8 + 1;
      }
      iVar7 = iVar7 + 1;
      iVar2 = (int)((ulong)((long)(result->test_part_results_).
                                  super__Vector_base<testing::TestPartResult,_std::allocator<testing::TestPartResult>_>
                                  ._M_impl.super__Vector_impl_data._M_finish -
                           (long)(result->test_part_results_).
                                 super__Vector_base<testing::TestPartResult,_std::allocator<testing::TestPartResult>_>
                                 ._M_impl.super__Vector_impl_data._M_start) >> 4);
    } while (SBORROW4(iVar7,iVar2 * -0x49249249) != iVar7 + iVar2 * 0x49249249 < 0);
    if (0 < iVar8) {
      std::__ostream_insert<char,std::char_traits<char>>(stream,"\n",1);
      poVar4 = std::__ostream_insert<char,std::char_traits<char>>(stream,(char *)local_d0,local_c8);
      std::__ostream_insert<char,std::char_traits<char>>(poVar4,"]",1);
    }
  }
  std::__ostream_insert<char,std::char_traits<char>>(stream,"\n",1);
  local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
  std::__cxx11::string::_M_construct((ulong)&local_b0,'\b');
  poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                     (stream,local_b0._M_dataplus._M_p,local_b0._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,"}",1);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
    operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
  }
  if (local_d0 != local_c0) {
    operator_delete(local_d0,local_c0[0] + 1);
  }
  return;
}

Assistant:

void JsonUnitTestResultPrinter::OutputJsonTestResult(::std::ostream* stream,
                                                     const TestResult& result) {
  const std::string kIndent = Indent(10);

  {
    int failures = 0;
    for (int i = 0; i < result.total_part_count(); ++i) {
      const TestPartResult& part = result.GetTestPartResult(i);
      if (part.failed()) {
        *stream << ",\n";
        if (++failures == 1) {
          *stream << kIndent << "\"" << "failures" << "\": [\n";
        }
        const std::string location =
            internal::FormatCompilerIndependentFileLocation(part.file_name(),
                                                            part.line_number());
        const std::string message =
            EscapeJson(location + "\n" + part.message());
        *stream << kIndent << "  {\n"
                << kIndent << "    \"failure\": \"" << message << "\",\n"
                << kIndent << "    \"type\": \"\"\n"
                << kIndent << "  }";
      }
    }

    if (failures > 0) *stream << "\n" << kIndent << "]";
  }

  {
    int skipped = 0;
    for (int i = 0; i < result.total_part_count(); ++i) {
      const TestPartResult& part = result.GetTestPartResult(i);
      if (part.skipped()) {
        *stream << ",\n";
        if (++skipped == 1) {
          *stream << kIndent << "\"" << "skipped" << "\": [\n";
        }
        const std::string location =
            internal::FormatCompilerIndependentFileLocation(part.file_name(),
                                                            part.line_number());
        const std::string message =
            EscapeJson(location + "\n" + part.message());
        *stream << kIndent << "  {\n"
                << kIndent << "    \"message\": \"" << message << "\"\n"
                << kIndent << "  }";
      }
    }

    if (skipped > 0) *stream << "\n" << kIndent << "]";
  }

  *stream << "\n" << Indent(8) << "}";
}